

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

expansion * __thiscall
GEO::expansion::assign_det_111_2x3
          (expansion *this,expansion *a21,expansion *a22,expansion *a23,expansion *a31,
          expansion *a32,expansion *a33)

{
  long lVar1;
  double dVar2;
  expansion *peVar3;
  expansion *peVar4;
  expansion *a11;
  index_t iVar5;
  size_t sVar6;
  expansion *peVar7;
  expansion *peVar8;
  expansion *peVar9;
  double dStack_80;
  expansion eStack_78;
  expansion *local_60;
  expansion *local_58;
  expansion *local_50;
  expansion *c13;
  expansion *c12;
  expansion *c11;
  expansion *a32_local;
  expansion *a31_local;
  expansion *a23_local;
  expansion *a22_local;
  expansion *a21_local;
  expansion *this_local;
  
  dStack_80 = 9.10954779342569e-318;
  local_58 = this;
  c11 = a32;
  a32_local = a31;
  a31_local = a23;
  a23_local = a22;
  a22_local = a21;
  a21_local = this;
  iVar5 = det2x2_capacity(a22,a23,a32,a33);
  dStack_80 = 9.1095823780209e-318;
  sVar6 = bytes(iVar5);
  peVar4 = a23_local;
  peVar3 = a31_local;
  peVar9 = c11;
  lVar1 = -(sVar6 + 0xf & 0xfffffffffffffff0);
  eStack_78.x_[0] = (double)((long)&eStack_78 + lVar1);
  *(undefined8 *)((long)&eStack_78 + lVar1 + -8) = 0x1c2285;
  iVar5 = det2x2_capacity(peVar4,peVar3,peVar9,a33);
  dVar2 = eStack_78.x_[0];
  *(undefined8 *)((long)&eStack_78 + lVar1 + -8) = 0x1c2290;
  expansion((expansion *)dVar2,iVar5);
  peVar4 = a23_local;
  peVar3 = a31_local;
  peVar9 = c11;
  dVar2 = eStack_78.x_[0];
  *(undefined8 *)((long)&eStack_78 + lVar1 + -8) = 0x1c22a9;
  c12 = assign_det2x2((expansion *)dVar2,peVar4,peVar3,peVar9,a33);
  peVar4 = a22_local;
  peVar3 = a31_local;
  peVar9 = a32_local;
  *(undefined8 *)((long)&eStack_78 + lVar1 + -8) = 0x1c22c2;
  iVar5 = det2x2_capacity(peVar3,peVar4,a33,peVar9);
  *(undefined8 *)((long)&eStack_78 + lVar1 + -8) = 0x1c22c9;
  sVar6 = bytes(iVar5);
  peVar4 = a22_local;
  peVar3 = a31_local;
  peVar9 = a32_local;
  peVar7 = (expansion *)((long)((long)&eStack_78 + lVar1) - (sVar6 + 0xf & 0xfffffffffffffff0));
  eStack_78.x_[1] = (double)peVar7;
  peVar7[-1].x_[1] = 9.11036300174133e-318;
  iVar5 = det2x2_capacity(peVar3,peVar4,a33,peVar9);
  dVar2 = eStack_78.x_[1];
  peVar7[-1].x_[1] = 9.11041734896238e-318;
  expansion((expansion *)dVar2,iVar5);
  peVar4 = a22_local;
  peVar3 = a31_local;
  peVar9 = a32_local;
  dVar2 = eStack_78.x_[1];
  peVar7[-1].x_[1] = 9.11054086537384e-318;
  c13 = assign_det2x2((expansion *)dVar2,peVar3,peVar4,a33,peVar9);
  peVar8 = a22_local;
  peVar4 = a23_local;
  peVar3 = a32_local;
  peVar9 = c11;
  peVar7[-1].x_[1] = 9.1106643817853e-318;
  iVar5 = det2x2_capacity(peVar8,peVar4,peVar3,peVar9);
  peVar7[-1].x_[1] = 9.1106989663805e-318;
  sVar6 = bytes(iVar5);
  peVar8 = a22_local;
  peVar4 = a23_local;
  peVar3 = a32_local;
  peVar9 = c11;
  peVar7 = (expansion *)((long)peVar7 - (sVar6 + 0xf & 0xfffffffffffffff0));
  local_60 = peVar7;
  peVar7[-1].x_[1] = 9.11092129592113e-318;
  iVar5 = det2x2_capacity(peVar8,peVar4,peVar3,peVar9);
  peVar9 = local_60;
  peVar7[-1].x_[1] = 9.11097564314218e-318;
  expansion(peVar9,iVar5);
  a11 = a22_local;
  peVar8 = a23_local;
  peVar4 = a32_local;
  peVar3 = c11;
  peVar9 = local_60;
  peVar7[-1].x_[1] = 9.11109915955364e-318;
  peVar8 = assign_det2x2(peVar9,a11,peVar8,peVar4,peVar3);
  peVar4 = c12;
  peVar3 = c13;
  peVar9 = local_58;
  local_50 = peVar8;
  peVar7[-1].x_[1] = 9.1112226759651e-318;
  peVar9 = assign_sum(peVar9,peVar4,peVar3,peVar8);
  return peVar9;
}

Assistant:

expansion& expansion::assign_det_111_2x3(
        const expansion& a21, const expansion& a22, const expansion& a23,
        const expansion& a31, const expansion& a32, const expansion& a33
    ) {
        const expansion& c11 = expansion_det2x2(a22, a23, a32, a33);
        const expansion& c12 = expansion_det2x2(a23, a21, a33, a31);
        const expansion& c13 = expansion_det2x2(a21, a22, a31, a32);
        return this->assign_sum(c11, c12, c13);
    }